

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
TSMuxer::getLastPts(vector<long,_std::allocator<long>_> *__return_storage_ptr__,TSMuxer *this)

{
  bool bVar1;
  size_type __n;
  int64_t iVar2;
  long local_58;
  reference local_50;
  long *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  TSMuxer *this_local;
  vector<long,_std::allocator<long>_> *rez;
  
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  __n = std::vector<long,_std::allocator<long>_>::size(&this->m_lastPts);
  std::vector<long,_std::allocator<long>_>::reserve(__return_storage_ptr__,__n);
  __end1 = std::vector<long,_std::allocator<long>_>::begin(&this->m_lastPts);
  i = (long *)std::vector<long,_std::allocator<long>_>::end(&this->m_lastPts);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                     *)&i), bVar1) {
    local_50 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
               ::operator*(&__end1);
    iVar2 = internalClockToPts(*local_50);
    local_58 = iVar2 + this->m_timeOffset;
    std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,&local_58);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int64_t> TSMuxer::getLastPts() const
{
    std::vector<int64_t> rez;
    rez.reserve(m_lastPts.size());
    for (const auto& i : m_lastPts) rez.push_back(internalClockToPts(i) + m_timeOffset);
    return rez;
}